

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void fft4pt(float *ioptr)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float t1i;
  float t1r;
  float t0i;
  float t0r;
  float f3i;
  float f3r;
  float f2i;
  float f2r;
  float f1i;
  float f1r;
  float f0i;
  float f0r;
  float *ioptr_local;
  
  fVar1 = *ioptr + ioptr[4];
  fVar2 = ioptr[1] + ioptr[5];
  fVar5 = *ioptr - ioptr[4];
  fVar6 = ioptr[1] - ioptr[5];
  fVar7 = ioptr[2] - ioptr[6];
  fVar8 = ioptr[3] - ioptr[7];
  fVar3 = ioptr[2] + ioptr[6];
  fVar4 = ioptr[3] + ioptr[7];
  *ioptr = fVar1 + fVar3;
  ioptr[1] = fVar2 + fVar4;
  ioptr[2] = fVar5 + fVar8;
  ioptr[3] = fVar6 - fVar7;
  ioptr[4] = fVar1 - fVar3;
  ioptr[5] = fVar2 - fVar4;
  ioptr[6] = fVar5 - fVar8;
  ioptr[7] = fVar6 + fVar7;
  return;
}

Assistant:

static inline void fft4pt(float *ioptr) {
/***   RADIX 4 fft	***/
float f0r, f0i, f1r, f1i, f2r, f2i, f3r, f3i;
float t0r, t0i, t1r, t1i;

	/* bit reversed load */
f0r = ioptr[0];
f0i = ioptr[1];
f1r = ioptr[4];
f1i = ioptr[5];
f2r = ioptr[2];
f2i = ioptr[3];
f3r = ioptr[6];
f3i = ioptr[7];

		/* Butterflys		*/
		/*
		f0	-	-	t0	-	-	f0
		f1	-  1 -	f1	-	-	f1
		f2	-	-	f2	-  1 -	f2
		f3	-  1 -	t1	- -i -	f3
		*/

t0r = f0r + f1r;
t0i = f0i + f1i;
f1r = f0r - f1r;
f1i = f0i - f1i;

t1r = f2r - f3r;
t1i = f2i - f3i;
f2r = f2r + f3r;
f2i = f2i + f3i;

f0r = t0r + f2r;
f0i = t0i + f2i;
f2r = t0r - f2r;
f2i = t0i - f2i;

f3r = f1r - t1i;
f3i = f1i + t1r;
f1r = f1r + t1i;
f1i = f1i - t1r;

	/* store result */
ioptr[0] = f0r;
ioptr[1] = f0i;
ioptr[2] = f1r;
ioptr[3] = f1i;
ioptr[4] = f2r;
ioptr[5] = f2i;
ioptr[6] = f3r;
ioptr[7] = f3i;
}